

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O3

void __thiscall
charls::process_transformed<charls::transform_none<unsigned_short>_>::encode_transform
          (process_transformed<charls::transform_none<unsigned_short>_> *this,void *source,
          void *destination,size_t pixel_count,size_t destination_stride)

{
  anon_union_2_2_7f9ecb7a_for_triplet<unsigned_short>_5 aVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  interleave_mode iVar7;
  int iVar8;
  long lVar9;
  anon_union_2_2_7f9ecb7a_for_triplet<unsigned_short>_5 *paVar10;
  size_t sVar11;
  
  if (this->parameters_->output_bgr == false) {
    iVar8 = this->frame_info_->component_count;
  }
  else {
    memcpy((this->temp_line_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start,source,pixel_count * 6);
    source = (this->temp_line_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar8 = this->frame_info_->component_count;
    if (pixel_count != 0) {
      paVar10 = &(((quad<unsigned_short> *)source)->super_triplet<unsigned_short>).field_2;
      sVar11 = pixel_count;
      do {
        aVar1 = paVar10[-2];
        paVar10[-2] = *paVar10;
        *paVar10 = aVar1;
        paVar10 = paVar10 + iVar8;
        sVar11 = sVar11 - 1;
      } while (sVar11 != 0);
    }
  }
  if (iVar8 == 4) {
    iVar7 = this->parameters_->interleave_mode;
    if (iVar7 == Line) {
      if (destination_stride <= pixel_count) {
        pixel_count = destination_stride;
      }
      if (pixel_count != 0) {
        uVar2 = (ushort)this->mask_;
        sVar11 = 0;
        do {
          uVar3 = (((quad<unsigned_short> *)((long)source + sVar11 * 8))->field_0).v4;
          uVar4 = (((quad<unsigned_short> *)((long)source + sVar11 * 8))->
                  super_triplet<unsigned_short>).field_1.v2;
          uVar5 = (((quad<unsigned_short> *)((long)source + sVar11 * 8))->
                  super_triplet<unsigned_short>).field_2.v3;
          *(unsigned_short *)((long)destination + sVar11 * 2) =
               (((quad<unsigned_short> *)((long)source + sVar11 * 8))->super_triplet<unsigned_short>
               ).field_0.v1 & uVar2;
          *(ushort *)((long)destination + sVar11 * 2 + destination_stride * 2) = uVar4 & uVar2;
          *(ushort *)((long)destination + sVar11 * 2 + destination_stride * 4) = uVar5 & uVar2;
          *(ushort *)((long)destination + sVar11 * 2 + destination_stride * 6) = uVar3 & uVar2;
          sVar11 = sVar11 + 1;
        } while (pixel_count != sVar11);
      }
    }
    else if (iVar7 == Sample) {
      transform_line<charls::transform_none<unsigned_short>,unsigned_short>
                ((quad<unsigned_short> *)destination,(quad<unsigned_short> *)source,pixel_count,
                 (transform_none<unsigned_short> *)&this->field_0x50,this->mask_);
      return;
    }
  }
  else if (iVar8 == 3) {
    if (this->parameters_->interleave_mode == Sample) {
      if (pixel_count != 0) {
        uVar6 = this->mask_;
        lVar9 = 0;
        do {
          uVar2 = *(ushort *)
                   ((long)&(((quad<unsigned_short> *)source)->super_triplet<unsigned_short>).field_0
                   + lVar9);
          uVar3 = *(ushort *)
                   ((long)&(((quad<unsigned_short> *)source)->super_triplet<unsigned_short>).field_1
                   + lVar9);
          *(ushort *)((long)destination + lVar9 + 4) =
               *(ushort *)
                ((long)&(((quad<unsigned_short> *)source)->super_triplet<unsigned_short>).field_2 +
                lVar9) & (ushort)uVar6;
          *(uint *)((long)destination + lVar9) = uVar2 & uVar6 | (uVar3 & uVar6) << 0x10;
          lVar9 = lVar9 + 6;
          pixel_count = pixel_count - 1;
        } while (pixel_count != 0);
      }
    }
    else {
      if (destination_stride <= pixel_count) {
        pixel_count = destination_stride;
      }
      if (pixel_count != 0) {
        uVar2 = (ushort)this->mask_;
        paVar10 = &(((quad<unsigned_short> *)source)->super_triplet<unsigned_short>).field_2;
        sVar11 = 0;
        do {
          uVar3 = ((anon_union_2_2_7f9ecc14_for_triplet<unsigned_short>_3 *)(paVar10 + -1))->v2;
          uVar4 = paVar10->v3;
          *(unsigned_short *)((long)destination + sVar11 * 2) =
               (((triplet<unsigned_short> *)(paVar10 + -2))->field_0).v1 & uVar2;
          *(ushort *)((long)destination + sVar11 * 2 + destination_stride * 2) = uVar3 & uVar2;
          *(ushort *)((long)destination + sVar11 * 2 + destination_stride * 4) = uVar4 & uVar2;
          sVar11 = sVar11 + 1;
          paVar10 = paVar10 + 3;
        } while (pixel_count != sVar11);
      }
    }
  }
  return;
}

Assistant:

void encode_transform(const void* source, void* destination, const size_t pixel_count,
                          const size_t destination_stride) noexcept
    {
        if (parameters_.output_bgr)
        {
            memcpy(temp_line_.data(), source, sizeof(triplet<size_type>) * pixel_count);
            transform_rgb_to_bgr(temp_line_.data(), frame_info_.component_count, pixel_count);
            source = temp_line_.data();
        }

        if (frame_info_.component_count == 3)
        {
            if (parameters_.interleave_mode == interleave_mode::sample)
            {
                transform_line(static_cast<triplet<size_type>*>(destination), static_cast<const triplet<size_type>*>(source),
                               pixel_count, transform_, mask_);
            }
            else
            {
                transform_triplet_to_line(static_cast<const triplet<size_type>*>(source), pixel_count,
                                          static_cast<size_type*>(destination), destination_stride, transform_, mask_);
            }
        }
        else if (frame_info_.component_count == 4)
        {
            if (parameters_.interleave_mode == interleave_mode::sample)
            {
                transform_line(static_cast<quad<size_type>*>(destination), static_cast<const quad<size_type>*>(source),
                               pixel_count, transform_, mask_);
            }
            else if (parameters_.interleave_mode == interleave_mode::line)
            {
                transform_quad_to_line(static_cast<const quad<size_type>*>(source), pixel_count,
                                       static_cast<size_type*>(destination), destination_stride, transform_, mask_);
            }
        }
    }